

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ABGRToAR30Row_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  auVar7._16_16_ = (undefined1  [16])libyuv::kShuffleBR30;
  auVar7._0_16_ = (undefined1  [16])libyuv::kShuffleBR30;
  auVar8._8_4_ = 0x40400404;
  auVar8._0_8_ = 0x4040040440400404;
  auVar8._12_4_ = 0x40400404;
  auVar8._16_4_ = 0x40400404;
  auVar8._20_4_ = 0x40400404;
  auVar8._24_4_ = 0x40400404;
  auVar8._28_4_ = 0x40400404;
  auVar9._8_4_ = 0x3ff003ff;
  auVar9._0_8_ = 0x3ff003ff3ff003ff;
  auVar9._12_4_ = 0x3ff003ff;
  auVar9._16_4_ = 0x3ff003ff;
  auVar9._20_4_ = 0x3ff003ff;
  auVar9._24_4_ = 0x3ff003ff;
  auVar9._28_4_ = 0x3ff003ff;
  auVar10._8_4_ = 0xc000ff00;
  auVar10._0_8_ = 0xc000ff00c000ff00;
  auVar10._12_4_ = 0xc000ff00;
  auVar10._16_4_ = 0xc000ff00;
  auVar10._20_4_ = 0xc000ff00;
  auVar10._24_4_ = 0xc000ff00;
  auVar10._28_4_ = 0xc000ff00;
  auVar11._8_4_ = 0x400404;
  auVar11._0_8_ = 0x40040400400404;
  auVar11._12_4_ = 0x400404;
  auVar11._16_4_ = 0x400404;
  auVar11._20_4_ = 0x400404;
  auVar11._24_4_ = 0x400404;
  auVar11._28_4_ = 0x400404;
  lVar5 = (long)dst - (long)src;
  do {
    auVar6 = vpshufb_avx2(*(undefined1 (*) [32])src,auVar7);
    auVar2 = vpand_avx2(*(undefined1 (*) [32])src,auVar10);
    auVar6 = vpmulhuw_avx2(auVar6,auVar8);
    auVar3 = vpmulhuw_avx2(auVar2,auVar11);
    auVar2 = vpand_avx2(auVar6,auVar9);
    auVar6 = vpslld_avx2(auVar3,10);
    auVar2 = vpor_avx2(auVar6,auVar2);
    *(undefined1 (*) [32])(lVar5 + (long)src) = auVar2;
    src = (uint8_t *)((long)src + 0x20);
    iVar4 = width + -8;
    bVar1 = 7 < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar1);
  return;
}

Assistant:

void ABGRToAR30Row_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "vbroadcastf128 %3,%%ymm2                  \n"  // shuffler for RB
      "vbroadcastss %4,%%ymm3                    \n"  // multipler for RB
      "vbroadcastss %5,%%ymm4                    \n"  // mask for R10 B10
      "vbroadcastss %6,%%ymm5                    \n"  // mask for AG
      "vbroadcastss %7,%%ymm6                    \n"  // multipler for AG
      "sub         %0,%1                         \n"

      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"  // fetch 8 ABGR pixels
      "vpshufb     %%ymm2,%%ymm0,%%ymm1          \n"  // R0B0
      "vpand       %%ymm5,%%ymm0,%%ymm0          \n"  // A0G0
      "vpmulhuw    %%ymm3,%%ymm1,%%ymm1          \n"  // X2 R16 X4  B10
      "vpmulhuw    %%ymm6,%%ymm0,%%ymm0          \n"  // X10 A2 X10 G10
      "vpand       %%ymm4,%%ymm1,%%ymm1          \n"  // X2 R10 X10 B10
      "vpslld      $10,%%ymm0,%%ymm0             \n"  // A2 x10 G10 x10
      "vpor        %%ymm1,%%ymm0,%%ymm0          \n"  // A2 R10 G10 B10
      "vmovdqu     %%ymm0,(%1,%0)                \n"  // store 8 AR30 pixels
      "add         $0x20,%0                      \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"

      : "+r"(src),          // %0
        "+r"(dst),          // %1
        "+r"(width)         // %2
      : "m"(kShuffleBR30),  // %3  reversed shuffler
        "m"(kMulRB10),      // %4
        "m"(kMaskRB10),     // %5
        "m"(kMaskAG10),     // %6
        "m"(kMulAG10)       // %7
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}